

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_cell_id_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_INT cell_id,REF_LONG ncell_expected,REF_GLOB *l2c
          ,REF_BOOL binary,FILE *file)

{
  REF_STATUS RVar1;
  uint uVar2;
  size_t sVar3;
  REF_MPI pRVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  REF_MPI ref_mpi;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  size_t __n;
  REF_NODE pRVar14;
  REF_INT ncell;
  REF_INT part;
  REF_MPI local_1c0;
  REF_NODE local_1b8;
  REF_GLOB *local_1b0;
  long local_1a8;
  REF_BOOL local_19c;
  long local_198;
  ulong local_190;
  REF_LONG local_188;
  void *local_180;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  
  local_1a8 = CONCAT44(local_1a8._4_4_,cell_id);
  ref_mpi = ref_node->ref_mpi;
  uVar2 = ref_cell->node_per;
  local_190 = (ulong)(int)uVar2;
  iVar13 = 0;
  local_1b8 = ref_node;
  local_1b0 = l2c;
  if (ref_mpi->id == 0) {
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    local_198 = 0;
    local_1c0 = ref_mpi;
    local_19c = binary;
    local_188 = ncell_expected;
    for (iVar12 = 0; iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
      RVar1 = ref_cell_nodes(ref_cell,iVar12,nodes);
      if ((RVar1 == 0) && (nodes[ref_cell->node_per] == (int)local_1a8)) {
        uVar2 = ref_cell_part(ref_cell,local_1b8,iVar12,&part);
        if (uVar2 != 0) {
          pcVar11 = "part";
          uVar8 = 0x28c;
          goto LAB_0018b475;
        }
        if (local_1c0->id == part) {
          for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            globals[uVar10] = l2c[nodes[uVar10]];
          }
          if (local_19c == 0) {
            for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
              globals[uVar10] = globals[uVar10] + 1;
              fprintf((FILE *)file," %ld");
            }
            fputc(10,(FILE *)file);
          }
          else {
            for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
              ncell = (REF_INT)globals[uVar10];
              sVar3 = fwrite(&ncell,4,1,(FILE *)file);
              if (sVar3 != 1) {
                __n = 1;
                uVar8 = 0x295;
                goto LAB_0018b1bd;
              }
            }
          }
          local_198 = local_198 + 1;
          l2c = local_1b0;
        }
      }
    }
    ncell_expected = local_188;
    ref_mpi = local_1c0;
    if (local_1c0->id != 0) goto LAB_0018aea7;
    local_1a8 = local_190 * 8;
    iVar13 = 1;
    while (ref_mpi = local_1c0, iVar13 < local_1c0->n) {
      local_1b0 = (REF_GLOB *)CONCAT44(local_1b0._4_4_,iVar13);
      uVar2 = ref_mpi_gather_recv(local_1c0,&ncell,1,1,iVar13);
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
        pcVar11 = "recv ncell";
        uVar8 = 0x2a7;
        goto LAB_0018af4c;
      }
      uVar2 = ncell * (int)local_190;
      if ((int)uVar2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2a8,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      local_1b8 = (REF_NODE)malloc((ulong)uVar2 * 8);
      if (local_1b8 == (REF_NODE)0x0) {
        pcVar11 = "malloc c2n of REF_GLOB NULL";
        uVar8 = 0x2a8;
        goto LAB_0018b414;
      }
      local_180 = malloc((ulong)uVar2 << 2);
      pRVar14 = local_1b8;
      if (local_180 == (void *)0x0) {
        pcVar11 = "malloc int_c2n of REF_INT NULL";
        uVar8 = 0x2a9;
        goto LAB_0018b414;
      }
      uVar2 = ref_mpi_gather_recv(local_1c0,local_1b8,uVar2,2,(REF_INT)local_1b0);
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
        pcVar11 = "recv c2n";
        uVar8 = 0x2ac;
        goto LAB_0018af4c;
      }
      uVar2 = ncell * (int)local_190;
      uVar10 = 0;
      if (0 < (int)uVar2) {
        uVar10 = (ulong)uVar2;
      }
      if (local_19c == 0) {
        for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
          *(long *)(&pRVar14->n + uVar5 * 2) = *(long *)(&pRVar14->n + uVar5 * 2) + 1;
        }
        for (lVar9 = 0; lVar6 = (long)ncell, lVar9 < lVar6; lVar9 = lVar9 + 1) {
          for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            fprintf((FILE *)file," %ld",*(undefined8 *)(&pRVar14->n + uVar10 * 2));
          }
          fputc(10,(FILE *)file);
          pRVar14 = (REF_NODE)((long)&pRVar14->n + local_1a8);
        }
      }
      else {
        for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
          *(REF_INT *)((long)local_180 + uVar5 * 4) = (&pRVar14->n)[uVar5 * 2];
        }
        __n = (size_t)(int)uVar2;
        sVar3 = fwrite(local_180,4,__n,(FILE *)file);
        if (sVar3 != __n) {
          uVar8 = 0x2b4;
LAB_0018b1bd:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar8,"ref_gather_cell_id_tec","int c2n",__n,sVar3);
          return 1;
        }
        lVar6 = (long)ncell;
      }
      local_198 = local_198 + lVar6;
      free(local_180);
      free(local_1b8);
      iVar13 = (REF_INT)local_1b0 + 1;
    }
LAB_0018b497:
    uVar2 = 0;
    if ((ref_mpi->id == 0) && (local_198 != local_188)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2e1,"ref_gather_cell_id_tec","cell count mismatch",local_188,local_198);
      uVar2 = 1;
    }
  }
  else {
    local_198 = 0;
LAB_0018aea7:
    ncell = 0;
    for (; iVar13 < ref_cell->max; iVar13 = iVar13 + 1) {
      RVar1 = ref_cell_nodes(ref_cell,iVar13,nodes);
      if ((RVar1 == 0) && (nodes[ref_cell->node_per] == (int)local_1a8)) {
        uVar2 = ref_cell_part(ref_cell,local_1b8,iVar13,&part);
        if (uVar2 != 0) {
          pcVar11 = "part";
          uVar8 = 0x2c9;
          goto LAB_0018b475;
        }
        if (ref_mpi->id == part) {
          ncell = ncell + 1;
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi,&ncell,1,1);
    uVar7 = local_190;
    if (uVar2 == 0) {
      iVar13 = (int)local_190;
      if (ncell * iVar13 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x2ce,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      pRVar4 = (REF_MPI)malloc((ulong)(uint)(ncell * iVar13) << 3);
      if (pRVar4 == (REF_MPI)0x0) {
        pcVar11 = "malloc c2n of REF_GLOB NULL";
        uVar8 = 0x2ce;
LAB_0018b414:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar8,"ref_gather_cell_id_tec",pcVar11);
        return 2;
      }
      ncell = 0;
      iVar12 = 0;
      uVar10 = 0;
      if (0 < iVar13) {
        uVar10 = uVar7 & 0xffffffff;
      }
      local_1c0 = pRVar4;
      local_188 = ncell_expected;
      for (; pRVar4 = local_1c0, iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
        RVar1 = ref_cell_nodes(ref_cell,iVar12,nodes);
        if ((RVar1 == 0) && (nodes[ref_cell->node_per] == (int)local_1a8)) {
          uVar2 = ref_cell_part(ref_cell,local_1b8,iVar12,&part);
          if (uVar2 != 0) {
            pcVar11 = "part";
            uVar8 = 0x2d2;
            goto LAB_0018b475;
          }
          if (ref_mpi->id == part) {
            for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
              *(REF_GLOB *)(&local_1c0->n + (long)(ncell * iVar13) * 2 + uVar7 * 2) =
                   local_1b0[nodes[uVar7]];
            }
            ncell = ncell + 1;
          }
        }
      }
      uVar2 = ref_mpi_gather_send(ref_mpi,local_1c0,iVar13 * ncell,2);
      if (uVar2 == 0) {
        free(pRVar4);
        goto LAB_0018b497;
      }
      pcVar11 = "send c2n";
      uVar8 = 0x2db;
LAB_0018b475:
      uVar7 = (ulong)uVar2;
    }
    else {
      uVar7 = (ulong)uVar2;
      pcVar11 = "send ncell";
      uVar8 = 0x2cd;
LAB_0018af4c:
      uVar2 = (uint)uVar7;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
           "ref_gather_cell_id_tec",uVar7,pcVar11);
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_id_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_INT cell_id,
    REF_LONG ncell_expected, REF_GLOB *l2c, REF_BOOL binary, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
          }
          if (binary) {
            for (node = 0; node < node_per; node++) {
              int int_node;
              int_node = (int)globals[node]; /* binary zero-based */
              REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              globals[node]++; /* ascii one-based */
              fprintf(file, " " REF_GLOB_FMT, globals[node]);
            }
            fprintf(file, "\n");
          }
          ncell_actual++;
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}